

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

void fl_make_path_for_file(char *path)

{
  char *pcVar1;
  size_t __n;
  char *p;
  size_t len;
  char *s;
  char *path_local;
  
  pcVar1 = strrchr(path,0x2f);
  if (pcVar1 != (char *)0x0) {
    __n = (long)pcVar1 - (long)path;
    pcVar1 = (char *)malloc(__n + 1);
    memcpy(pcVar1,path,__n);
    pcVar1[__n] = '\0';
    fl_make_path(pcVar1);
    free(pcVar1);
  }
  return;
}

Assistant:

void fl_make_path_for_file( const char *path ) {

  const char *s = strrchr( path, '/' );
  if ( !s ) return;
  size_t len =  (s-path);
  char *p = (char*)malloc( len+1 );
  memcpy( p, path, len );
  p[len] = 0;
  fl_make_path( p );
  free( p );

}